

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O3

void __thiscall helics::tcp::TcpCommsSS::queue_tx_function(TcpCommsSS *this)

{
  _Atomic_word *p_Var1;
  ulong uVar2;
  ActionMessage *act;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  io_context *piVar4;
  _Alloc_hider _Var5;
  TcpConnection *pTVar6;
  uint __val;
  undefined4 uVar7;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  pointer ppVar9;
  _Head_base<0UL,_asio::io_context::work_*,_false> _Var10;
  atomic<gmlc::networking::AsioContextManager::loop_mode> aVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s1;
  uint uVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  int *piVar16;
  mapped_type *pmVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  char *__s;
  iterator iVar19;
  mapped_type *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  uint uVar22;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  ActionMessage *command;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar24;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>
  *rt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *address;
  pointer ppVar25;
  int __fd;
  ulong uVar26;
  ActionMessage *pAVar27;
  undefined8 uVar28;
  pointer __pos;
  string *in_R8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> this_01;
  TcpConnection *__tmp;
  uint __len;
  size_type __rlen;
  pointer __k;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  pVar30;
  pointer conn;
  pointer new_connect;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  made_connections;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  routes;
  LoopHandle contextLoop;
  string cstring;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  established_routes;
  ActionMessage cmessage;
  action_t in_stack_fffffffffffffb0c;
  undefined1 local_4e8 [32];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_4c8;
  undefined1 local_4c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  undefined8 local_4a0;
  undefined1 local_498 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488 [11];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *local_3d0;
  shared_ptr<gmlc::networking::TcpConnection> local_3a8 [3];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  local_378;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  _Alloc_hider local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  _Head_base<0UL,_asio::io_context_*,_false> local_318;
  _Head_base<0UL,_asio::io_context::work_*,_false> _Stack_310;
  undefined8 local_308;
  __native_type local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2c8;
  byte local_2c0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_298;
  size_t local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  undefined8 local_280;
  pointer pbStack_278;
  pointer local_270;
  pointer pbStack_268;
  SocketFactory local_258;
  undefined1 local_240 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_230;
  code *local_228;
  _Alloc_hider local_220;
  undefined1 local_218 [16];
  code *local_208;
  _Head_base<0UL,_asio::io_context_*,_false> local_200;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
  local_1d8;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  local_198;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  ActionMessage local_e8;
  timespec *ptVar29;
  
  if (((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) &&
     ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0)) {
    iVar14 = getDefaultPort(0xb);
    LOCK();
    (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar14;
    UNLOCK();
  }
  if (((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == false) &&
     (this->outgoingConnectionsAllowed == false)) {
    message_01._M_str = "no server and no outgoing connections-> no way to connect to comms";
    message_01._M_len = 0x42;
    CommsInterface::logError((CommsInterface *)this,message_01);
    CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
    CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
    return;
  }
  local_498._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_488[0]._M_allocated_capacity = local_488[0]._M_allocated_capacity & 0xffffffffffffff00;
  local_498._0_8_ = local_488;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)local_358,(string *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._0_8_ != local_488) {
    operator_delete((void *)local_498._0_8_,local_488[0]._M_allocated_capacity + 1);
  }
  if ((this->super_NetworkCommsInterface).encrypted == true) {
    gmlc::networking::SocketFactory::SocketFactory(&local_258,&this->encryption_config,true);
  }
  else {
    local_258.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
    super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_258.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
    super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_258.encrypted = false;
    local_258.handshake_server = false;
    local_258._18_6_ = 0;
  }
  gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)local_240);
  if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
    uVar15 = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
    in_R8 = (string *)(ulong)(uVar15 & 0xffff);
    gmlc::networking::TcpServer::create
              ((TcpServer *)local_498,&local_258,*(io_context **)(local_358._0_8_ + 0x40),
               &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress,
               (uint16_t)uVar15,true,
               (this->super_NetworkCommsInterface).super_CommsInterface.maxMessageSize);
    this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_;
    local_4a0 = local_498._0_8_;
    do {
      if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_4a0 + 0xf0))->_M_local_buf[0] & 1U) == 0) {
        local_108._8_8_ = 0;
        local_f0 = std::
                   _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                   ::_M_invoke;
        local_f8 = std::
                   _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                   ::_M_manager;
        local_108._M_unused._M_object = this;
        std::
        function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
        ::operator=((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                     *)(local_4a0 + 0x90),
                    (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                     *)&local_108);
        if (local_f8 != (code *)0x0) {
          (*local_f8)((_Any_data *)&local_108,(_Any_data *)&local_108,__destroy_functor);
        }
        local_128._8_8_ = 0;
        local_110 = std::
                    _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                    ::_M_invoke;
        local_118 = std::
                    _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                    ::_M_manager;
        local_128._M_unused._M_object = this;
        std::
        function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
        operator=((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                   *)(local_4a0 + 0xb0),
                  (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                   *)&local_128);
        if (local_118 != (code *)0x0) {
          (*local_118)((_Any_data *)&local_128,(_Any_data *)&local_128,__destroy_functor);
        }
        gmlc::networking::TcpServer::start((TcpServer *)local_4a0);
        goto LAB_002c423e;
      }
      message._M_str = "retrying tcp bind";
      message._M_len = 0x11;
      CommsInterface::logWarning((CommsInterface *)this,message);
      local_498._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_498._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x8f0d180;
      do {
        iVar14 = nanosleep((timespec *)local_498,(timespec *)local_498);
        if (iVar14 != -1) break;
        piVar16 = __errno_location();
      } while (*piVar16 == 4);
      bVar13 = gmlc::networking::TcpServer::reConnect
                         ((TcpServer *)local_4a0,
                          (milliseconds)
                          (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout
                          .__r);
    } while (bVar13);
    message_00._M_str = "unable to bind to tcp connection socket";
    message_00._M_len = 0x27;
    iVar14 = 0x27;
    CommsInterface::logError((CommsInterface *)this,message_00);
    gmlc::networking::TcpServer::close((TcpServer *)local_4a0,iVar14);
    CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
    CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
    goto LAB_002c608b;
  }
  this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
LAB_002c423e:
  ActionMessage::ActionMessage(&local_e8,cmd_protocol);
  local_e8.messageID = 299;
  local_4c8._M_pi = this_01._M_pi;
  NetworkCommsInterface::getAddress_abi_cxx11_
            ((string *)local_498,&this->super_NetworkCommsInterface);
  local_e8.payload.bufferSize = local_498._8_8_;
  uVar28 = local_498._0_8_;
  if ((byte *)local_498._0_8_ == local_e8.payload.heap) {
  }
  else {
    SmallBuffer::reserve(&local_e8.payload,local_498._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.payload.bufferSize !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      memcpy(local_e8.payload.heap,(void *)uVar28,local_e8.payload.bufferSize);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._0_8_ != local_488) {
    operator_delete((void *)local_498._0_8_,local_488[0]._M_allocated_capacity + 1);
  }
  ActionMessage::packetize_abi_cxx11_((string *)local_1f8,&local_e8);
  local_378.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_198._M_impl.super__Rb_tree_header._M_header;
  local_198._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_198._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_198._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198._M_impl.super__Rb_tree_header._M_header._M_right =
       local_198._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->outgoingConnectionsAllowed == true) {
    address = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (this->connections).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (this->connections).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (address != pbVar3) {
      do {
        in_R8 = (string *)0x0;
        __n = address;
        gmlc::networking::establishConnection
                  ((networking *)local_498,&local_258,*(io_context **)(local_358._0_8_ + 0x40),
                   address,(milliseconds)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1a0 = std::
                      _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                      ::_M_invoke;
          local_1a8 = std::
                      _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                      ::_M_manager;
          local_1b8._M_unused._M_object = this;
          gmlc::networking::TcpConnection::setDataCall
                    ((TcpConnection *)local_498._0_8_,
                     (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                      *)&local_1b8);
          if (local_1a8 != (code *)0x0) {
            (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
          }
          local_1d8.super__Function_base._M_functor._8_8_ = (__pthread_internal_list *)0x0;
          local_1d8._M_invoker =
               std::
               _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
               ::_M_invoke;
          local_1d8.super__Function_base._M_manager =
               std::
               _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
               ::_M_manager;
          local_1d8.super__Function_base._M_functor._M_unused._M_object = this;
          gmlc::networking::TcpConnection::setErrorCall((TcpConnection *)local_498._0_8_,&local_1d8)
          ;
          pvVar24 = extraout_RDX;
          if ((__pthread_internal_list *)local_1d8.super__Function_base._M_manager !=
              (__pthread_internal_list *)0x0) {
            (*local_1d8.super__Function_base._M_manager)(&local_1d8,&local_1d8,3);
            pvVar24 = extraout_RDX_00;
          }
          gmlc::networking::TcpConnection::send
                    ((TcpConnection *)local_498._0_8_,(int)local_1f8,pvVar24,(size_t)__n,(int)in_R8)
          ;
          gmlc::networking::TcpConnection::startReceive((TcpConnection *)local_498._0_8_);
          std::
          vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
          ::
          emplace_back<std::__cxx11::string_const&,std::shared_ptr<gmlc::networking::TcpConnection>>
                    ((vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                      *)&local_378,address,(shared_ptr<gmlc::networking::TcpConnection> *)local_498)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_);
        }
        address = address + 1;
      } while (address != pbVar3);
    }
  }
  CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
  this_01._M_pi = local_4c8._M_pi;
  local_3a8[0].super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_3a8[0].super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_348 + 8);
  local_348._8_4_ = 0;
  local_338._M_p = (pointer)0x0;
  local_328._8_8_ = 0;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
  local_330 = paVar21;
  local_328._M_allocated_capacity = (size_type)paVar21;
  if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
LAB_002c49d5:
    CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
    local_3d0 = &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue;
    do {
      local_318._M_head_impl = (io_context *)0x0;
      _Stack_310._M_head_impl = (work *)0x9aac0f0000000000;
      local_308._0_4_ = 0;
      local_308._4_4_ = -1700000000;
      local_2c0[0x20] = 0;
      local_2c0[0x21] = 0;
      local_2c0[0x22] = 0;
      local_2c0[0x23] = 0;
      local_2c0[0x24] = 0;
      local_2c0[0x25] = 0;
      local_2c0[0x26] = 0;
      local_2c0[0x27] = 0;
      paStack_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      local_2c0[0x10] = 0;
      local_2c0[0x11] = 0;
      local_2c0[0x12] = 0;
      local_2c0[0x13] = 0;
      local_2c0[0x14] = 0;
      local_2c0[0x15] = 0;
      local_2c0[0x16] = 0;
      local_2c0[0x17] = 0;
      local_2c0[0x18] = 0;
      local_2c0[0x19] = 0;
      local_2c0[0x1a] = 0;
      local_2c0[0x1b] = 0;
      local_2c0[0x1c] = 0;
      local_2c0[0x1d] = 0;
      local_2c0[0x1e] = 0;
      local_2c0[0x1f] = 0;
      local_2c0[0] = 0;
      local_2c0[1] = 0;
      local_2c0[2] = 0;
      local_2c0[3] = 0;
      local_2c0[4] = 0;
      local_2c0[5] = 0;
      local_2c0[6] = 0;
      local_2c0[7] = 0;
      local_2c0[8] = 0;
      local_2c0[9] = 0;
      local_2c0[10] = 0;
      local_2c0[0xb] = 0;
      local_2c0[0xc] = 0;
      local_2c0[0xd] = 0;
      local_2c0[0xe] = 0;
      local_2c0[0xf] = 0;
      aStack_2d8._8_8_ = (element_type *)0x0;
      _Stack_2c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_300.__data.__list.__next = (__pthread_internal_list *)0x0;
      aStack_2d8._M_allocated_capacity = 0;
      local_300._16_8_ = 0;
      local_300.__data.__list.__prev = (__pthread_internal_list *)0x0;
      local_300.__align = 0;
      local_300._8_8_ = 0;
      local_290 = 0x40;
      local_288 = &aStack_2d8;
      local_270 = (pointer)0x0;
      pbStack_268 = (pointer)0x0;
      local_280._0_1_ = false;
      local_280._1_1_ = false;
      local_280._2_1_ = false;
      local_280._3_1_ = '\0';
      local_280._4_4_ = 0;
      pbStack_278 = (pointer)0x0;
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::pop((pair<helics::route_id,_helics::ActionMessage> *)local_498,local_3d0);
      uVar7 = local_498._0_4_;
      act = (ActionMessage *)(local_498 + 8);
      pAVar27 = act;
      ActionMessage::operator=((ActionMessage *)&local_318,act);
      ActionMessage::~ActionMessage(act);
      ppVar9 = local_378.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = local_3a8[0].
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if ((((action_t)local_318._M_head_impl == cmd_protocol_priority) ||
          ((action_t)local_318._M_head_impl == cmd_protocol_big)) ||
         ((action_t)local_318._M_head_impl == cmd_protocol)) {
        if (uVar7 == 0) goto LAB_002c4ba2;
        if (uVar7 != -1) goto LAB_002c4b0c;
        if (local_318._M_head_impl._4_4_ < 299) {
          if (local_318._M_head_impl._4_4_ == 0xe9) {
            if (local_378.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_378.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              bVar13 = false;
              __k = local_378.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
              do {
                if ((((__k->second).
                      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr != (element_type *)0x0) &&
                    (paStack_298 ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(__k->first)._M_string_length)) &&
                   ((paStack_298 ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0 ||
                    (iVar14 = bcmp(local_288,(__k->first)._M_dataplus._M_p,(size_t)paStack_298),
                    iVar14 == 0)))) {
                  local_498._0_4_ = local_308._4_4_;
                  std::
                  _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                  ::
                  _M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>>
                            ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                              *)local_348,(route_id *)local_498,&__k->second);
                  aVar11._M_i = local_308._4_4_;
                  pmVar17 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                                          *)&local_198,&__k->first);
                  pmVar17->rid = aVar11._M_i;
                  bVar13 = true;
                }
                __k = __k + 1;
              } while (__k != ppVar9);
              this_01._M_pi = local_4c8._M_pi;
              if (bVar13) goto LAB_002c4d8b;
            }
            local_498._0_8_ = local_488;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_498,local_288,(long)paStack_298 + (long)local_288);
            iVar19 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                     ::find(&local_198,(key_type *)local_498);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._0_8_ != local_488) {
              operator_delete((void *)local_498._0_8_,local_488[0]._M_allocated_capacity + 1);
            }
            if ((_Rb_tree_header *)iVar19._M_node == &local_198._M_impl.super__Rb_tree_header) {
              if (this->outgoingConnectionsAllowed == true) {
                piVar4 = *(io_context **)(local_358._0_8_ + 0x40);
                local_498._0_8_ = local_488;
                paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_498;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)paVar21,local_288,(long)paStack_298 + (long)local_288);
                in_R8 = (string *)0x0;
                gmlc::networking::establishConnection
                          ((networking *)local_4e8,&local_258,piVar4,(string *)paVar21,
                           (milliseconds)0x0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._0_8_ != local_488) {
                  operator_delete((void *)local_498._0_8_,local_488[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  local_218._8_8_ = 0;
                  local_200._M_head_impl =
                       (io_context *)
                       std::
                       _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                       ::_M_invoke;
                  local_208 = std::
                              _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                              ::_M_manager;
                  local_218._0_8_ = this;
                  gmlc::networking::TcpConnection::setDataCall
                            ((TcpConnection *)local_4e8._0_8_,
                             (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                              *)local_218);
                  if (local_208 != (code *)0x0) {
                    (*local_208)(local_218,local_218,3);
                  }
                  local_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_220._M_p =
                       (pointer)std::
                                _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                                ::_M_invoke;
                  local_228 = std::
                              _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                              ::_M_manager;
                  local_240._8_8_ = this;
                  gmlc::networking::TcpConnection::setErrorCall
                            ((TcpConnection *)local_4e8._0_8_,
                             (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                              *)(local_240 + 8));
                  pvVar24 = extraout_RDX_03;
                  if (local_228 != (code *)0x0) {
                    (*local_228)((_Any_data *)(local_240 + 8),(_Any_data *)(local_240 + 8),
                                 __destroy_functor);
                    pvVar24 = extraout_RDX_04;
                  }
                  gmlc::networking::TcpConnection::send
                            ((TcpConnection *)local_4e8._0_8_,(int)local_1f8,pvVar24,(size_t)paVar21
                             ,(int)in_R8);
                  gmlc::networking::TcpConnection::startReceive((TcpConnection *)local_4e8._0_8_);
                  local_498._0_4_ = local_308._4_4_;
                  std::
                  _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                  ::
                  _M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>>
                            ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                              *)local_348,(route_id *)local_498,
                             (shared_ptr<gmlc::networking::TcpConnection> *)local_4e8);
                  aVar11._M_i = local_308._4_4_;
                  local_498._0_8_ = local_488;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_498,local_288,(long)paStack_298 + (long)local_288);
                  pmVar17 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                                          *)&local_198,(key_type *)local_498);
                  pmVar17->rid = aVar11._M_i;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_498._0_8_ != local_488) {
                    operator_delete((void *)local_498._0_8_,local_488[0]._M_allocated_capacity + 1);
                  }
                }
                goto LAB_002c550c;
              }
              local_4e8._0_8_ = local_4e8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4e8,"outgoing connections not allowed ","");
              local_4c0._0_8_ = &local_4b0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4c0,local_288,(long)paStack_298 + (long)local_288);
              uVar26 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_4e8 + 0x10)) {
                uVar26 = local_4e8._16_8_;
              }
              uVar2 = (long)&((_Alloc_hider *)local_4e8._8_8_)->_M_p + local_4c0._8_8_;
              in_R8 = (string *)local_4e8._8_8_;
              if (uVar26 < uVar2) {
                uVar28 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c0._0_8_ != &local_4b0) {
                  uVar28 = local_4b0._M_allocated_capacity;
                }
                if ((ulong)uVar28 < uVar2) goto LAB_002c5390;
                pbVar20 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_4c0,0,0,(char *)local_4e8._0_8_,local_4e8._8_8_);
              }
              else {
LAB_002c5390:
                pbVar20 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_4e8,(char *)local_4c0._0_8_,local_4c0._8_8_);
              }
              local_498._0_8_ = local_488;
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar20->_M_dataplus)._M_p;
              paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&pbVar20->field_2;
              if (paVar18 == paVar21) {
                local_488[0]._0_8_ = paVar21->_M_allocated_capacity;
                local_488[0]._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
              }
              else {
                local_488[0]._0_8_ = paVar21->_M_allocated_capacity;
                local_498._0_8_ = paVar18;
              }
              local_498._8_8_ = pbVar20->_M_string_length;
              (pbVar20->_M_dataplus)._M_p = (pointer)paVar21;
              pbVar20->_M_string_length = 0;
              paVar21->_M_local_buf[0] = '\0';
              message_06._M_str = (char *)local_498._0_8_;
              message_06._M_len = local_498._8_8_;
              CommsInterface::logWarning((CommsInterface *)this,message_06);
              goto LAB_002c5472;
            }
            if (iVar19._M_node[2]._M_color == _S_red) {
              local_498._0_4_ = local_308._4_4_;
              std::
              _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
              ::
              _M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>&>
                        ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                          *)local_348,(route_id *)local_498,local_3a8);
            }
            else {
              local_498._0_4_ = local_308._4_4_;
              __args_1 = std::
                         map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                         ::operator[]((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                                       *)local_348,(key_type *)(iVar19._M_node + 2));
              std::
              _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
              ::
              _M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>&>
                        ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                          *)local_348,(route_id *)local_498,__args_1);
            }
          }
          else {
            if (local_318._M_head_impl._4_4_ != 0xf4) goto LAB_002c5010;
            local_498._0_4_ = local_308._4_4_;
            pVar30 = std::
                     _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                     ::equal_range((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                                    *)local_348,(key_type *)local_498);
            std::
            _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
            ::_M_erase_aux((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                            *)local_348,(_Base_ptr)pVar30.first._M_node,
                           (_Base_ptr)pVar30.second._M_node);
          }
        }
        else if (local_318._M_head_impl._4_4_ == 299) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            gmlc::networking::TcpServer::findSocket((TcpServer *)local_4e8,(int)local_4a0);
            __s1 = local_288;
            paVar23 = paStack_298;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4e8._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              message_04._M_str = "(tcpss) unable to locate socket";
              message_04._M_len = 0x1f;
              CommsInterface::logWarning((CommsInterface *)this,message_04);
            }
            else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_3a8[0].
                        super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0) {
              if ((paStack_298 !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(this->super_NetworkCommsInterface).super_CommsInterface.brokerName.
                      _M_string_length) ||
                 ((paStack_298 !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0 &&
                  (iVar14 = bcmp(local_288,
                                 (this->super_NetworkCommsInterface).super_CommsInterface.brokerName
                                 ._M_dataplus._M_p,(size_t)paStack_298), iVar14 != 0)))) {
                gmlc::networking::makePortAddress
                          ((string *)local_498,(string *)local_3d8,
                           (this->super_NetworkCommsInterface).brokerPort);
                uVar28 = local_498._0_8_;
                if ((paVar23 ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_498._8_8_) &&
                   ((paVar23 ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0 ||
                    (iVar14 = bcmp(__s1,(void *)local_498._0_8_,(size_t)paVar23), iVar14 == 0)))) {
                  bVar13 = true;
                }
                else {
                  bVar13 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)uVar28 != local_488) {
                  operator_delete((void *)uVar28,local_488[0]._M_allocated_capacity + 1);
                }
                paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4e8._0_8_;
                if (!bVar13) {
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4e8._0_8_ ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) goto LAB_002c550c;
                  goto LAB_002c4e90;
                }
              }
              _Var8._M_pi = local_3a8[0].
                            super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
              local_3a8[0].
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_;
              local_4e8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_4e8._8_8_ = (string *)0x0;
              local_3a8[0].
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)paVar18;
              if ((string *)_Var8._M_pi != (string *)0x0) {
                CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_pi);
              }
            }
            else {
LAB_002c4e90:
              local_498._0_8_ = paStack_298;
              local_498._8_8_ = local_288;
              paVar21 = local_288;
              std::
              vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
              ::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<gmlc::networking::TcpConnection>>
                        ((vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                          *)&local_378,(basic_string_view<char,_std::char_traits<char>_> *)local_498
                         ,(shared_ptr<gmlc::networking::TcpConnection> *)local_4e8);
            }
LAB_002c550c:
            if ((string *)local_4e8._8_8_ != (string *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_);
            }
          }
        }
        else if (local_318._M_head_impl._4_4_ == 0x16570bf) {
          CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
        }
        else {
          if (local_318._M_head_impl._4_4_ == 0x9db) goto LAB_002c5ea7;
LAB_002c5010:
          message_03._M_str = "unrecognized control command";
          message_03._M_len = 0x1c;
          CommsInterface::logWarning((CommsInterface *)this,message_03);
        }
      }
      else if (uVar7 == 0) {
LAB_002c4ba2:
        if ((((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8[0].
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0)) {
          ActionMessage::packetize_abi_cxx11_((string *)local_498,(ActionMessage *)&local_318);
          gmlc::networking::TcpConnection::send
                    (this_00,(int)(string *)local_498,__buf_00,(size_t)paVar21,(int)in_R8);
          goto LAB_002c4d6f;
        }
        local_4e8._0_8_ = local_4e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4e8,"(tcpss) no route to broker for message, message dropped :",
                   "");
        __s = actionMessageType(in_stack_fffffffffffffb0c);
        pbVar20 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4e8,__s);
        local_498._0_8_ = local_488;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar20->_M_dataplus)._M_p;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&pbVar20->field_2;
        if (paVar18 == paVar21) {
          local_488[0]._0_8_ = paVar21->_M_allocated_capacity;
          local_488[0]._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
        }
        else {
          local_488[0]._0_8_ = paVar21->_M_allocated_capacity;
          local_498._0_8_ = paVar18;
        }
        local_498._8_8_ = pbVar20->_M_string_length;
        (pbVar20->_M_dataplus)._M_p = (pointer)paVar21;
        pbVar20->_M_string_length = 0;
        (pbVar20->field_2)._M_local_buf[0] = '\0';
        message_02._M_str = (char *)local_498._0_8_;
        message_02._M_len = local_498._8_8_;
        CommsInterface::logWarning((CommsInterface *)this,message_02);
        uVar28 = local_488[0]._M_allocated_capacity;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._0_8_ != local_488) {
LAB_002c4d2d:
          operator_delete(paVar18,uVar28 + 1);
        }
LAB_002c4d35:
        uVar28 = local_4e8._16_8_;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4e8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_4e8 + 0x10)) {
LAB_002c4d83:
          operator_delete(paVar18,uVar28 + 1);
        }
      }
      else {
LAB_002c4b0c:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_348 + 8);
          _Var5._M_p = local_338._M_p;
          do {
            paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var5._M_p;
            paVar21 = paVar18;
            iVar14 = *(int *)&((_Alloc_hider *)
                              &((_Rb_tree_node_base *)(paVar23->_M_local_buf + 0x20))->_M_color)->
                              _M_p;
            paVar18 = paVar23;
            if (iVar14 < (int)uVar7) {
              paVar18 = paVar21;
            }
            _Var5._M_p = *(pointer *)((long)paVar23 + (ulong)(iVar14 < (int)uVar7) * 8 + 0x10);
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)_Var5._M_p !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0);
          if (paVar18 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_348 + 8)) {
            if (iVar14 < (int)uVar7) {
              paVar23 = paVar21;
            }
            if (*(int *)&((_Alloc_hider *)
                         &((_Rb_tree_node_base *)(paVar23->_M_local_buf + 0x20))->_M_color)->_M_p <=
                (int)uVar7) {
              pTVar6 = *(TcpConnection **)(paVar18->_M_local_buf + 0x28);
              ActionMessage::packetize_abi_cxx11_((string *)local_498,(ActionMessage *)&local_318);
              gmlc::networking::TcpConnection::send
                        (pTVar6,(int)(string *)local_498,__buf_01,(size_t)paVar21,(int)in_R8);
              goto LAB_002c4d6f;
            }
          }
        }
        if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
          ActionMessage::packetize_abi_cxx11_((string *)local_498,(ActionMessage *)&local_318);
          gmlc::networking::TcpConnection::send
                    (this_00,(int)(string *)local_498,__buf,(size_t)paVar21,(int)in_R8);
LAB_002c4d6f:
          uVar28 = local_488[0]._M_allocated_capacity;
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._0_8_ == local_488) goto LAB_002c4d8b;
          goto LAB_002c4d83;
        }
        if ((action_t)local_318._M_head_impl < cmd_remove_filter) {
          uVar15 = (action_t)local_318._M_head_impl + cmd_disconnect;
          if ((0x26 < uVar15) ||
             ((paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x600001fe1, (0x600001fe1U >> ((ulong)uVar15 & 0x3f) & 1) == 0 &&
              (((ulong)uVar15 != 0x26 || (local_300._8_8_ != 0x7fffffffffffffff)))))) {
LAB_002c4dc0:
            local_4e8._0_8_ = local_4e8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4e8,"(tcpss) unknown message destination message dropped ",""
                      );
            prettyPrintString_abi_cxx11_((string *)local_4c0,(helics *)&local_318,command);
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_4e8 + 0x10)) {
              uVar26 = local_4e8._16_8_;
            }
            uVar2 = (long)&((_Alloc_hider *)local_4e8._8_8_)->_M_p + local_4c0._8_8_;
            in_R8 = (string *)local_4e8._8_8_;
            if (uVar26 < uVar2) {
              uVar28 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c0._0_8_ != &local_4b0) {
                uVar28 = local_4b0._M_allocated_capacity;
              }
              if ((ulong)uVar28 < uVar2) goto LAB_002c4e42;
              pbVar20 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_4c0,0,0,(char *)local_4e8._0_8_,local_4e8._8_8_);
            }
            else {
LAB_002c4e42:
              pbVar20 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_4e8,(char *)local_4c0._0_8_,local_4c0._8_8_);
            }
            local_498._0_8_ = local_488;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar20->_M_dataplus)._M_p;
            paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&pbVar20->field_2;
            if (paVar18 == paVar21) {
              local_488[0]._0_8_ = paVar21->_M_allocated_capacity;
              local_488[0]._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
            }
            else {
              local_488[0]._0_8_ = paVar21->_M_allocated_capacity;
              local_498._0_8_ = paVar18;
            }
            local_498._8_8_ = pbVar20->_M_string_length;
            (pbVar20->_M_dataplus)._M_p = (pointer)paVar21;
            pbVar20->_M_string_length = 0;
            paVar21->_M_local_buf[0] = '\0';
            message_05._M_str = (char *)local_498._0_8_;
            message_05._M_len = local_498._8_8_;
            CommsInterface::logWarning((CommsInterface *)this,message_05);
LAB_002c5472:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._0_8_ != local_488) {
              operator_delete((void *)local_498._0_8_,local_488[0]._M_allocated_capacity + 1);
            }
            uVar28 = local_4b0._M_allocated_capacity;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4c0._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c0._0_8_ != &local_4b0) goto LAB_002c4d2d;
            goto LAB_002c4d35;
          }
        }
        else {
          uVar15 = (action_t)local_318._M_head_impl + 0xfffffc12;
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ulong)uVar15;
          if ((((3 < uVar15) || (uVar15 == 1)) &&
              ((action_t)local_318._M_head_impl != cmd_remove_filter)) &&
             ((action_t)local_318._M_head_impl != cmd_remove_endpoint)) goto LAB_002c4dc0;
        }
      }
LAB_002c4d8b:
      ActionMessage::~ActionMessage((ActionMessage *)&local_318);
    } while( true );
  }
  uVar15 = (this->super_NetworkCommsInterface).brokerPort;
  if ((int)uVar15 < 0) {
    uVar15 = getDefaultPort(0xb);
    (this->super_NetworkCommsInterface).brokerPort = uVar15;
  }
  if (this->outgoingConnectionsAllowed != true) goto LAB_002c49d5;
  __val = -uVar15;
  if (0 < (int)uVar15) {
    __val = uVar15;
  }
  __len = 1;
  if (9 < __val) {
    uVar26 = (ulong)__val;
    uVar12 = 4;
    do {
      __len = uVar12;
      uVar22 = (uint)uVar26;
      if (uVar22 < 100) {
        __len = __len - 2;
        goto LAB_002c47f3;
      }
      if (uVar22 < 1000) {
        __len = __len - 1;
        goto LAB_002c47f3;
      }
      if (uVar22 < 10000) goto LAB_002c47f3;
      uVar26 = uVar26 / 10000;
      uVar12 = __len + 4;
    } while (99999 < uVar22);
    __len = __len + 1;
  }
LAB_002c47f3:
  piVar4 = *(io_context **)(local_358._0_8_ + 0x40);
  local_498._0_8_ = local_488;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498,
             (ulong)(__len + -((int)uVar15 >> 0x1f)),'-');
  in_R8 = (string *)local_498;
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_498._0_8_ + (ulong)(uint)-((int)uVar15 >> 0x1f)),__len,__val);
  paVar21 = local_3d8;
  gmlc::networking::establishConnection
            ((networking *)&local_318,&local_258,piVar4,(string *)local_3d8,in_R8,
             (milliseconds)
             (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r);
  _Var10._M_head_impl = (work *)_Stack_310;
  local_3a8[0].super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_318;
  _Var8._M_pi = local_3a8[0].
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_318._M_head_impl = (io_context *)0x0;
  _Stack_310._M_head_impl = (work *)0x0;
  local_3a8[0].super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var10._M_head_impl;
  if (((string *)_Var8._M_pi != (string *)0x0) &&
     (CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_pi),
     (string *)_Stack_310._M_head_impl != (string *)0x0)) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_310._M_head_impl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._0_8_ != local_488) {
    operator_delete((void *)local_498._0_8_,local_488[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8[0].
         super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_148._8_8_ = 0;
    local_130 = std::
                _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                ::_M_invoke;
    local_138 = std::
                _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                ::_M_manager;
    local_148._M_unused._M_object = this;
    gmlc::networking::TcpConnection::setDataCall
              (local_3a8[0].
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                       *)&local_148);
    if (local_138 != (code *)0x0) {
      (*local_138)((_Any_data *)&local_148,(_Any_data *)&local_148,__destroy_functor);
    }
    local_168._8_8_ = 0;
    local_150 = std::
                _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                ::_M_invoke;
    local_158 = std::
                _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                ::_M_manager;
    local_168._M_unused._M_object = this;
    gmlc::networking::TcpConnection::setErrorCall
              (local_3a8[0].
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                       *)&local_168);
    pvVar24 = extraout_RDX_01;
    if (local_158 != (code *)0x0) {
      (*local_158)((_Any_data *)&local_168,(_Any_data *)&local_168,__destroy_functor);
      pvVar24 = extraout_RDX_02;
    }
    gmlc::networking::TcpConnection::send
              (local_3a8[0].
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(int)local_1f8,pvVar24,(size_t)paVar21,(int)in_R8);
    gmlc::networking::TcpConnection::startReceive
              (local_3a8[0].
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    gmlc::networking::makePortAddress
              ((string *)local_498,(string *)local_3d8,
               (this->super_NetworkCommsInterface).brokerPort);
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                            *)&local_198,(key_type *)local_498);
    pmVar17->rid = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ != local_488) {
      operator_delete((void *)local_498._0_8_,local_488[0]._M_allocated_capacity + 1);
    }
    goto LAB_002c49d5;
  }
  message_07._M_str = "initial connection to broker timed out";
  message_07._M_len = 0x26;
  iVar14 = 0x26;
  CommsInterface::logError((CommsInterface *)this,message_07);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    gmlc::networking::TcpServer::close((TcpServer *)local_4a0,iVar14);
  }
  CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
  CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
  goto LAB_002c6024;
LAB_002c5ea7:
  ActionMessage::~ActionMessage((ActionMessage *)&local_318);
  ppVar9 = local_378.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __pos = local_378.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  for (ppVar25 = local_378.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_378.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = __pos, ppVar25 != ppVar9; ppVar25 = ppVar25 + 1) {
    pTVar6 = (ppVar25->second).
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pTVar6 != (TcpConnection *)0x0) {
      gmlc::networking::TcpConnection::close(pTVar6,(int)pAVar27);
    }
    __pos = local_378.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::_M_erase_at_end(&local_378,__pos);
  for (paVar21 = local_330;
      paVar21 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_348 + 8);
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::_Rb_tree_increment((_Rb_tree_node_base *)paVar21)) {
    if (*(TcpConnection **)(paVar21->_M_local_buf + 0x28) != (TcpConnection *)0x0) {
      gmlc::networking::TcpConnection::close
                (*(TcpConnection **)(paVar21->_M_local_buf + 0x28),(int)__pos);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8[0].
         super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    gmlc::networking::TcpConnection::close
              (local_3a8[0].
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(int)__pos);
  }
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::clear((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
           *)local_348);
  _Var8._M_pi = local_3a8[0].
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_3a8[0].super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_3a8[0].super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((string *)_Var8._M_pi != (string *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_pi);
  }
  CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_498._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_498._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x2faf080;
    do {
      ptVar29 = (timespec *)local_498;
      iVar14 = nanosleep((timespec *)local_498,(timespec *)local_498);
      __fd = (int)ptVar29;
      if (iVar14 != -1) break;
      piVar16 = __errno_location();
    } while (*piVar16 == 4);
    gmlc::networking::TcpServer::close((TcpServer *)local_4a0,__fd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)this_01._M_pi !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_pi);
    }
    this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if ((this->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i == CONNECTED) {
    CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
  }
LAB_002c6024:
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::~_Rb_tree((_Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
               *)local_348);
  if ((string *)
      local_3a8[0].super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (string *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_3a8[0].
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  ::~_Rb_tree(&local_198);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::~vector(&local_378);
  if ((work *)local_1f8._0_8_ != (work *)local_1e8) {
    operator_delete((void *)local_1f8._0_8_,local_1e8._0_8_ + 1);
  }
  ActionMessage::~ActionMessage(&local_e8);
LAB_002c608b:
  std::
  unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
  ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                 *)local_240);
  if (local_258.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
      super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_258.super_enable_shared_from_this<gmlc::networking::SocketFactory>.
                 _M_weak_this.
                 super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar14 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar14 = (local_258.super_enable_shared_from_this<gmlc::networking::SocketFactory>.
                _M_weak_this.
                super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_weak_count;
      (local_258.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
       super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar14 + -1;
    }
    if (iVar14 == 1) {
      (*(local_258.super_enable_shared_from_this<gmlc::networking::SocketFactory>._M_weak_this.
         super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if ((element_type *)local_358._8_8_ != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)this_01._M_pi !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_pi);
  }
  return;
}

Assistant:

void TcpCommsSS::queue_tx_function()
{
    if (serverMode && (PortNumber < 0)) {
        PortNumber = getDefaultBrokerPort();
    }
    if (!serverMode && !outgoingConnectionsAllowed) {
        logError("no server and no outgoing connections-> no way to connect to comms");
        setRxStatus(ConnectionStatus::ERRORED);
        setTxStatus(ConnectionStatus::ERRORED);
        return;
    }
    gmlc::networking::TcpServer::pointer server;
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                          gmlc::networking::SocketFactory();
    auto contextLoop = ioctx->startContextLoop();
    auto dataCall =
        [this](const TcpConnection::pointer& connection, const char* data, size_t datasize) {
            return dataReceive(connection.get(), data, datasize);
        };
    CommsInterface* ci = this;
    auto errorCall = [ci](const TcpConnection::pointer& connection, const std::error_code& error) {
        return commErrorHandler(ci, connection.get(), error);
    };

    if (serverMode) {
        server = gmlc::networking::TcpServer::create(sf,
                                                     ioctx->getBaseContext(),
                                                     localTargetAddress,
                                                     static_cast<uint16_t>(PortNumber.load()),
                                                     true,
                                                     maxMessageSize);
        while (!server->isReady()) {
            logWarning("retrying tcp bind");
            std::this_thread::sleep_for(std::chrono::milliseconds(150));
            auto connected = server->reConnect(connectionTimeout);
            if (!connected) {
                logError("unable to bind to tcp connection socket");
                server->close();
                setRxStatus(ConnectionStatus::ERRORED);
                setTxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
        server->setDataCall(dataCall);
        server->setErrorCall(errorCall);
        server->start();
    }

    // generate a local protocol connection string
    ActionMessage cmessage(CMD_PROTOCOL);
    cmessage.messageID = CONNECTION_INFORMATION;
    cmessage.payload = getAddress();
    auto cstring = cmessage.packetize();

    std::vector<std::pair<std::string, TcpConnection::pointer>> made_connections;
    std::map<std::string, route_id> established_routes;
    if (outgoingConnectionsAllowed) {
        for (const auto& conn : connections) {
            try {
                auto new_connect =
                    gmlc::networking::establishConnection(sf, ioctx->getBaseContext(), conn);

                if (new_connect) {
                    new_connect->setDataCall(dataCall);
                    new_connect->setErrorCall(errorCall);
                    new_connect->send(cstring);
                    new_connect->startReceive();

                    made_connections.emplace_back(conn, std::move(new_connect));
                }
            }
            catch (const std::exception& e) {
                logWarning(std::string("unable to establish connection with ") + conn +
                           "::" + e.what());
            }
        }
    }
    setRxStatus(ConnectionStatus::CONNECTED);
    std::vector<char> buffer;

    TcpConnection::pointer brokerConnection;

    std::map<route_id, TcpConnection::pointer> routes;  // for all the other possible routes
    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    if (hasBroker) {
        if (brokerPort < 0) {
            brokerPort = getDefaultBrokerPort();
        }
        if (outgoingConnectionsAllowed) {
            try {
                brokerConnection = gmlc::networking::establishConnection(sf,
                                                                         ioctx->getBaseContext(),
                                                                         brokerTargetAddress,
                                                                         std::to_string(brokerPort),
                                                                         std::chrono::milliseconds(
                                                                             connectionTimeout));
                if (!brokerConnection) {
                    logError("initial connection to broker timed out");

                    if (server) {
                        server->close();
                    }
                    setTxStatus(ConnectionStatus::ERRORED);
                    setRxStatus(ConnectionStatus::ERRORED);
                    return;
                }

                brokerConnection->setDataCall(dataCall);
                brokerConnection->setErrorCall(errorCall);

                brokerConnection->send(cstring);
                brokerConnection->startReceive();
            }
            catch (std::exception& e) {
                logError(std::string("unable to establish connection with ") + brokerTargetAddress +
                         "::" + e.what());
                setTxStatus(ConnectionStatus::ERRORED);
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
            established_routes[gmlc::networking::makePortAddress(brokerTargetAddress, brokerPort)] =
                parent_route_id;
        }
    }

    setTxStatus(ConnectionStatus::CONNECTED);

    bool haltLoop{false};
    //  std::vector<ActionMessage> txlist;
    while (!haltLoop) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (rid == control_route) {
                processed = true;
                switch (cmd.messageID) {
                    case CONNECTION_INFORMATION:
                        if (server) {
                            auto conn = server->findSocket(cmd.getExtraData());
                            if (conn) {
                                if (!brokerConnection) {  // check if the connection matches the
                                                          // broker
                                    if ((cmd.payload.to_string() == brokerName) ||
                                        (cmd.payload.to_string() ==
                                         gmlc::networking::makePortAddress(brokerTargetAddress,
                                                                           brokerPort))) {
                                        brokerConnection = std::move(conn);
                                        break;
                                    }
                                }
                                if (conn) {
                                    made_connections.emplace_back(cmd.payload.to_string(),
                                                                  std::move(conn));
                                }
                            } else {
                                logWarning("(tcpss) unable to locate socket");
                            }
                        }
                        break;
                    case NEW_ROUTE: {
                        bool established = false;

                        for (auto& mc : made_connections) {
                            if ((mc.second) && (cmd.payload.to_string() == mc.first)) {
                                routes.emplace(route_id{cmd.getExtraData()}, std::move(mc.second));
                                established = true;
                                established_routes[mc.first] = route_id{cmd.getExtraData()};
                            }
                        }
                        if (!established) {
                            auto efind =
                                established_routes.find(std::string(cmd.payload.to_string()));
                            if (efind != established_routes.end()) {
                                established = true;
                                if (efind->second == parent_route_id) {
                                    routes.emplace(route_id{cmd.getExtraData()}, brokerConnection);
                                } else {
                                    routes.emplace(route_id{cmd.getExtraData()},
                                                   routes[efind->second]);
                                }
                            }
                        }

                        if (!established) {
                            if (outgoingConnectionsAllowed) {
                                try {
                                    auto new_connect = gmlc::networking::establishConnection(
                                        sf,
                                        ioctx->getBaseContext(),
                                        std::string(cmd.payload.to_string()));
                                    if (new_connect) {
                                        new_connect->setDataCall(dataCall);
                                        new_connect->setErrorCall(errorCall);
                                        new_connect->send(cstring);
                                        new_connect->startReceive();
                                        routes.emplace(route_id{cmd.getExtraData()},
                                                       std::move(new_connect));
                                        established_routes[std::string(cmd.payload.to_string())] =
                                            route_id{cmd.getExtraData()};
                                    }
                                }
                                catch (const std::exception& e) {
                                    logWarning(std::string("unable to establish connection with ") +
                                               std::string(cmd.payload.to_string()) +
                                               "::" + e.what());
                                }
                            } else {
                                logWarning(std::string("outgoing connections not allowed ") +
                                           std::string(cmd.payload.to_string()));
                            }
                        }
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case CLOSE_RECEIVER:
                        setRxStatus(ConnectionStatus::TERMINATED);
                        break;
                    case DISCONNECT:
                        haltLoop = true;
                        continue;
                    default:
                        logWarning("unrecognized control command");
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }

        if (rid == parent_route_id) {
            if ((hasBroker) && (brokerConnection)) {
                try {
                    brokerConnection->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("broker send 0 ") +
                                     actionMessageType(cmd.action()) + ':' + se.what());
                        }
                    }
                }
            } else {
                logWarning(
                    std::string("(tcpss) no route to broker for message, message dropped :") +
                    actionMessageType(cmd.action()));
            }
        } else {
            //  txlist.push_back(cmd);
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                try {
                    rt_find->second->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("rt send ") + std::to_string(rid.baseValue()) +
                                     "::" + se.what());
                        }
                    }
                }
            } else {
                if (hasBroker) {
                    try {
                        brokerConnection->send(cmd.packetize());
                    }
                    catch (const std::system_error& se) {
                        if (se.code() != asio::error::connection_aborted) {
                            if (!isDisconnectCommand(cmd)) {
                                logError(std::string("broker send ") +
                                         std::to_string(rid.baseValue()) + " ::" + se.what());
                            }
                        }
                    }
                } else {
                    if (!isDisconnectCommand(cmd)) {
                        logWarning(
                            std::string("(tcpss) unknown message destination message dropped ") +
                            prettyPrintString(cmd));
                    }
                }
            }
        }
    }  // while (!haltLoop)

    for (auto& rt : made_connections) {
        if (rt.second) {
            rt.second->close();
        }
    }
    made_connections.clear();
    for (auto& rt : routes) {
        if (rt.second) {
            rt.second->close();
        }
    }
    if (brokerConnection) {
        brokerConnection->close();
    }
    routes.clear();
    brokerConnection = nullptr;
    setTxStatus(ConnectionStatus::TERMINATED);
    if (server) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        server->close();
        server = nullptr;
    }
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        setRxStatus(ConnectionStatus::TERMINATED);
    }
}